

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_annotation.c
# Opt level: O1

HPDF_STATUS HPDF_TextAnnot_SetIcon(HPDF_Annotation annot,HPDF_AnnotIcon icon)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  
  HVar1 = CheckSubType(annot,HPDF_ANNOT_TEXT_NOTES);
  if (HVar1 == 0) {
    HVar2 = 0x101c;
  }
  else {
    if (HPDF_ANNOT_ICON_INSERT < icon) {
      HVar2 = HPDF_RaiseError(annot->error,0x1072,(ulong)icon);
      return HVar2;
    }
    HVar2 = HPDF_Dict_AddName(annot,"Name",
                              HPDF_ANNOT_ICON_NAMES_NAMES_rel +
                              *(int *)(HPDF_ANNOT_ICON_NAMES_NAMES_rel + (ulong)icon * 4));
    if (HVar2 != 0) {
      HVar2 = HPDF_CheckError(annot->error);
      return HVar2;
    }
    HVar2 = 0;
  }
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_TextAnnot_SetIcon  (HPDF_Annotation  annot,
                         HPDF_AnnotIcon   icon)
{
    HPDF_PTRACE((" HPDF_TextAnnot_SetIcon\n"));

    if (!CheckSubType (annot, HPDF_ANNOT_TEXT_NOTES))
        return HPDF_INVALID_ANNOTATION;

    if (icon >= HPDF_ANNOT_ICON_EOF)
        return HPDF_RaiseError (annot->error, HPDF_ANNOT_INVALID_ICON,
                (HPDF_STATUS)icon);

    if (HPDF_Dict_AddName (annot, "Name",
        HPDF_ANNOT_ICON_NAMES_NAMES[(HPDF_INT)icon]) != HPDF_OK)
        return HPDF_CheckError (annot->error);

    return HPDF_OK;
}